

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * ae_strtofflags(char *s,unsigned_long *setp,unsigned_long *clrp)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  bool bVar3;
  size_t flag_length;
  size_t length;
  char *failed;
  unsigned_long clear;
  unsigned_long set;
  flag *flag;
  char *end;
  char *start;
  unsigned_long *clrp_local;
  unsigned_long *setp_local;
  char *s_local;
  
  failed = (char *)0x0;
  clear = 0;
  length = 0;
  end = s;
  while( true ) {
    bVar3 = true;
    if ((*end != '\t') && (bVar3 = true, *end != ' ')) {
      bVar3 = *end == ',';
    }
    if (!bVar3) break;
    end = end + 1;
  }
  do {
    if (*end == '\0') {
      if (setp != (unsigned_long *)0x0) {
        *setp = clear;
      }
      if (clrp != (unsigned_long *)0x0) {
        *clrp = (unsigned_long)failed;
      }
      return (char *)length;
    }
    flag = (flag *)end;
    while( true ) {
      bVar3 = false;
      if (((*(char *)&flag->name != '\0') && (bVar3 = false, *(char *)&flag->name != '\t')) &&
         (bVar3 = false, *(char *)&flag->name != ' ')) {
        bVar3 = *(char *)&flag->name != ',';
      }
      if (!bVar3) break;
      flag = (flag *)((long)&flag->name + 1);
    }
    __n = (long)flag - (long)end;
    for (set = (unsigned_long)fileflags; *(long *)set != 0; set = set + 0x20) {
      sVar2 = strlen(*(char **)set);
      if ((__n == sVar2) && (iVar1 = memcmp(end,*(void **)set,__n), iVar1 == 0)) {
        failed = (char *)(*(ulong *)(set + 0x10) | (ulong)failed);
        clear = *(ulong *)(set + 0x18) | clear;
        break;
      }
      if ((__n == sVar2 - 2) && (iVar1 = memcmp(end,(void *)(*(long *)set + 2),__n), iVar1 == 0)) {
        clear = *(ulong *)(set + 0x10) | clear;
        failed = (char *)(*(ulong *)(set + 0x18) | (ulong)failed);
        break;
      }
    }
    if ((*(long *)set == 0) && (length == 0)) {
      length = (size_t)end;
    }
    end = (char *)flag;
    while( true ) {
      bVar3 = true;
      if ((*end != '\t') && (bVar3 = true, *end != ' ')) {
        bVar3 = *end == ',';
      }
      if (!bVar3) break;
      end = end + 1;
    }
  } while( true );
}

Assistant:

static const char *
ae_strtofflags(const char *s, unsigned long *setp, unsigned long *clrp)
{
	const char *start, *end;
	const struct flag *flag;
	unsigned long set, clear;
	const char *failed;

	set = clear = 0;
	start = s;
	failed = NULL;
	/* Find start of first token. */
	while (*start == '\t'  ||  *start == ' '  ||  *start == ',')
		start++;
	while (*start != '\0') {
		size_t length;
		/* Locate end of token. */
		end = start;
		while (*end != '\0'  &&  *end != '\t'  &&
		    *end != ' '  &&  *end != ',')
			end++;
		length = end - start;
		for (flag = fileflags; flag->name != NULL; flag++) {
			size_t flag_length = strlen(flag->name);
			if (length == flag_length
			    && memcmp(start, flag->name, length) == 0) {
				/* Matched "noXXXX", so reverse the sense. */
				clear |= flag->set;
				set |= flag->clear;
				break;
			} else if (length == flag_length - 2
			    && memcmp(start, flag->name + 2, length) == 0) {
				/* Matched "XXXX", so don't reverse. */
				set |= flag->set;
				clear |= flag->clear;
				break;
			}
		}
		/* Ignore unknown flag names. */
		if (flag->name == NULL  &&  failed == NULL)
			failed = start;

		/* Find start of next token. */
		start = end;
		while (*start == '\t'  ||  *start == ' '  ||  *start == ',')
			start++;

	}

	if (setp)
		*setp = set;
	if (clrp)
		*clrp = clear;

	/* Return location of first failure. */
	return (failed);
}